

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSphere::IfcSphere(IfcSphere *this)

{
  IfcSphere *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x50,"IfcSphere");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00fd28b8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSphere,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSphere,_1UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00fd2930);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfd2800;
  *(undefined8 *)&this->field_0x50 = 0xfd28a0;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfd2828;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfd2850;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xfd2878;
  return;
}

Assistant:

IfcSphere() : Object("IfcSphere") {}